

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::FBXImporter::CanRead(FBXImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  __type _Var1;
  bool bVar2;
  allocator<char> local_71;
  string local_70;
  char *tokens [1];
  
  BaseImporter::GetExtension(&local_70,pFile);
  std::__cxx11::string::string<std::allocator<char>>((string *)tokens,"fbx",&local_71);
  _Var1 = std::operator==(&local_70,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          tokens);
  std::__cxx11::string::~string((string *)tokens);
  bVar2 = true;
  if (_Var1) goto LAB_004f9521;
  if (local_70._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_004f94fb;
  }
  else if (pIOHandler != (IOSystem *)0x0 && checkSig) {
LAB_004f94fb:
    tokens[0] = "fbx";
    bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,200,false,false);
    goto LAB_004f9521;
  }
  bVar2 = false;
LAB_004f9521:
  std::__cxx11::string::~string((string *)&local_70);
  return bVar2;
}

Assistant:

bool FBXImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == std::string( desc.mFileExtensions ) ) {
        return true;
    }

    else if ((!extension.length() || checkSig) && pIOHandler)   {
        // at least ASCII-FBX files usually have a 'FBX' somewhere in their head
        const char* tokens[] = {"fbx"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}